

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O0

bool TestEigen(Matrix *m,initializer_list<EigenAnswer> c,double eps)

{
  const_iterator pEVar1;
  double dVar2;
  EigenAnswer *now;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<EigenAnswer> *__range1;
  double currentError;
  double eps_local;
  Matrix *m_local;
  initializer_list<EigenAnswer> c_local;
  
  c_local._M_array = (iterator)c._M_len;
  m_local = (Matrix *)c._M_array;
  __range1 = (initializer_list<EigenAnswer> *)0x0;
  __end1 = std::initializer_list<EigenAnswer>::begin((initializer_list<EigenAnswer> *)&m_local);
  pEVar1 = std::initializer_list<EigenAnswer>::end((initializer_list<EigenAnswer> *)&m_local);
  for (; __end1 != pEVar1; __end1 = __end1 + 1) {
    dVar2 = Utils::EigValueNorm(m,&__end1->vector,__end1->value);
    __range1 = (initializer_list<EigenAnswer> *)(dVar2 + (double)__range1);
  }
  return (double)__range1 < eps;
}

Assistant:

bool TestEigen(const Matrix &m, std::initializer_list<EigenAnswer> c, double eps)
{
    double currentError = 0;

    for (const auto &now: c)
    {
        currentError += Utils::EigValueNorm(m, now.vector, now.value);
    }

    return eps > currentError;
}